

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::setBackground(QMdiArea *this,QBrush *brush)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar2 = QBrush::operator!=((QBrush *)(lVar1 + 0x3a8),brush);
  if (bVar2) {
    QBrush::operator=((QBrush *)(lVar1 + 0x3a8),brush);
    this_00 = *(QWidget **)(lVar1 + 0x2b0);
    bVar2 = (bool)QBrush::isOpaque();
    QWidget::setAttribute(this_00,WA_OpaquePaintEvent,bVar2);
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
    return;
  }
  return;
}

Assistant:

void QMdiArea::setBackground(const QBrush &brush)
{
    Q_D(QMdiArea);
    if (d->background != brush) {
        d->background = brush;
        d->viewport->setAttribute(Qt::WA_OpaquePaintEvent, brush.isOpaque());
        d->viewport->update();
    }
}